

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O0

void __thiscall tl::StrT<char>::resize(StrT<char> *this,u32 size)

{
  char *pcVar1;
  uint local_24;
  u32 i;
  char *str;
  u32 size_local;
  StrT<char> *this_local;
  
  if (size == 0) {
    this->_size = 0;
    *this->_str = '\0';
  }
  else {
    pcVar1 = growIfNeeded(this,size);
    if (pcVar1 != (char *)0x0) {
      for (local_24 = 0; local_24 < this->_size; local_24 = local_24 + 1) {
        pcVar1[local_24] = this->_str[local_24];
      }
      if ((this->_str != &s_emptyStr<char>) && (this->_str != (char *)0x0)) {
        operator_delete__(this->_str);
      }
      this->_str = pcVar1;
    }
    this->_size = size;
    this->_str[size] = '\0';
  }
  return;
}

Assistant:

void StrT<CharT>::resize(u32 size)
{
    if(size == 0) {
        _size = 0;
        _str[0] = 0;
        return;
    }
    if(auto str = growIfNeeded(size)) {
        for(u32 i = 0; i < _size; i++) {
            str[i] = _str[i];
        }
        if(_str != s_emptyStr<CharT>) {
            delete[] _str;
        }
        _str = str;
    }
    _size = size;
    _str[size] = 0;
}